

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O3

bool IsGlobalScope(ScopeData *scope)

{
  TypeBase **ppTVar1;
  bool bVar2;
  
  if ((scope == (ScopeData *)0x0) || (scope->type == SCOPE_TEMPORARY)) {
    bVar2 = false;
  }
  else {
    do {
      bVar2 = scope->scope == (ScopeData *)0x0;
      if (bVar2) {
        return bVar2;
      }
      if (scope->ownerFunction != (FunctionData *)0x0) {
        return bVar2;
      }
      ppTVar1 = &scope->ownerType;
      scope = scope->scope;
    } while (*ppTVar1 == (TypeBase *)0x0);
  }
  return bVar2;
}

Assistant:

bool IsGlobalScope(ScopeData *scope)
{
	if(!scope)
		return false;

	if(scope->type == SCOPE_TEMPORARY)
		return false;

	while(scope->scope)
	{
		if(scope->ownerFunction)
			return false;

		if(scope->ownerType)
			return false;

		scope = scope->scope;
	}

	return true;
}